

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
mjs::interpreter::impl::impl
          (impl *this,gc_heap *h,version ver,on_statement_executed_type *on_statement_executed)

{
  bool bVar1;
  global_object *pgVar2;
  object_ptr *p;
  function_object *pfVar3;
  gc_heap_ptr<mjs::gc_string> *name;
  object *poVar4;
  gc_heap_ptr<mjs::interpreter::impl::scope> local_170;
  gc_heap_ptr<mjs::object> local_160;
  object_ptr local_150;
  value local_140;
  string local_118;
  gc_heap_ptr<mjs::object> local_108;
  gc_heap_ptr<mjs::gc_string> local_f8;
  undefined1 local_e8 [16];
  anon_class_8_1_8991fb9c_for_f local_d8;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_d0;
  value local_c0;
  undefined1 local_98 [8];
  object_ptr func_obj;
  gc_heap_ptr<mjs::object> local_80;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_70;
  anon_class_8_1_8991fb9c local_60;
  function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_()>
  local_58;
  on_statement_executed_type *local_28;
  on_statement_executed_type *on_statement_executed_local;
  gc_heap *pgStack_18;
  version ver_local;
  gc_heap *h_local;
  impl *this_local;
  
  this->heap_ = h;
  this->strict_mode_ = false;
  local_28 = on_statement_executed;
  on_statement_executed_local._4_4_ = ver;
  pgStack_18 = h;
  h_local = (gc_heap *)this;
  gc_heap_ptr<mjs::interpreter::impl::scope>::gc_heap_ptr(&this->active_scope_);
  global_object::make((global_object *)&this->global_,pgStack_18,on_statement_executed_local._4_4_,
                      &this->strict_mode_);
  std::function<void_(const_mjs::statement_&,_const_mjs::completion_&)>::function
            (&this->on_statement_executed_,local_28);
  std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>::vector(&this->stack_trace_);
  this->gc_cooldown_ = 0;
  std::
  vector<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ::vector(&this->label_set_);
  this->labels_valid_for_ = (statement *)0x0;
  source_extend::source_extend(&this->current_extend_);
  this->was_direct_call_to_eval_ = false;
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(&this->global_);
  local_60.this = this;
  std::function<std::__cxx11::wstring()>::
  function<mjs::interpreter::impl::impl(mjs::gc_heap&,mjs::version,std::function<void(mjs::statement_const&,mjs::completion_const&)>const&)::_lambda()_1_,void>
            ((function<std::__cxx11::wstring()> *)&local_58,&local_60);
  global_object::set_stack_trace_function(pgVar2,&local_58);
  std::
  function<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_()>
  ::~function(&local_58);
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(&this->global_);
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view(&local_70,L"eval");
  bVar1 = object::has_property(&pgVar2->super_object,&local_70);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!global_->has_property(L\"eval\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                  ,0x10a,
                  "mjs::interpreter::impl::impl(gc_heap &, version, const on_statement_executed_type &)"
                 );
  }
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::global_object,void>(&local_80,&this->global_);
  func_obj.super_gc_heap_ptr_untyped._8_8_ = this;
  put_native_function<mjs::interpreter::impl::impl(mjs::gc_heap&,mjs::version,std::function<void(mjs::statement_const&,mjs::completion_const&)>const&)::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_1_>
            (&this->global_,&local_80,"eval",
             (anon_class_8_1_8991fb9c_for_f *)&func_obj.super_gc_heap_ptr_untyped.pos_,1);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_80);
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(&this->global_);
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            (&local_d0,L"Function");
  (**(pgVar2->super_object)._vptr_object)(&local_c0,pgVar2,&local_d0);
  p = value::object_value(&local_c0);
  gc_heap_ptr<mjs::object>::gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_98,p);
  value::~value(&local_c0);
  bVar1 = gc_heap_ptr_untyped::has_type<mjs::function_object>((gc_heap_ptr_untyped *)local_98);
  if (!bVar1) {
    __assert_fail("func_obj.has_type<function_object>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                  ,0x12f,
                  "mjs::interpreter::impl::impl(gc_heap &, version, const on_statement_executed_type &)"
                 );
  }
  pfVar3 = (function_object *)
           gc_heap_ptr<mjs::object>::operator*((gc_heap_ptr<mjs::object> *)local_98);
  local_d8.this = this;
  gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_98);
  object::class_name((object *)local_e8);
  name = string::unsafe_raw_get((string *)local_e8);
  gc_heap_ptr<mjs::gc_string>::gc_heap_ptr(&local_f8,(nullptr_t)0x0);
  function_object::
  put_function<mjs::interpreter::impl::impl(mjs::gc_heap&,mjs::version,std::function<void(mjs::statement_const&,mjs::completion_const&)>const&)::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_2_>
            (pfVar3,&local_d8,name,&local_f8,1);
  gc_heap_ptr<mjs::gc_string>::~gc_heap_ptr(&local_f8);
  string::~string((string *)local_e8);
  pfVar3 = (function_object *)
           gc_heap_ptr<mjs::object>::operator*((gc_heap_ptr<mjs::object> *)local_98);
  function_object::default_construct_function(pfVar3);
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(&this->global_);
  (*(pgVar2->super_object)._vptr_object[0xc])(&local_108);
  poVar4 = gc_heap_ptr<mjs::object>::operator->(&local_108);
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(&this->global_);
  (*(pgVar2->super_object)._vptr_object[0x13])(&local_118,pgVar2,"constructor");
  value::value(&local_140,(object_ptr *)local_98);
  (*poVar4->_vptr_object[1])(poVar4,&local_118,&local_140,2);
  value::~value(&local_140);
  string::~string(&local_118);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_108);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::global_object,void>(&local_160,&this->global_);
  gc_heap_ptr<mjs::interpreter::impl::scope>::gc_heap_ptr(&local_170,(nullptr_t)0x0);
  make_scope(&local_150,(scope_ptr *)&local_160);
  gc_heap_ptr<mjs::interpreter::impl::scope>::operator=
            (&this->active_scope_,(gc_heap_ptr<mjs::interpreter::impl::scope> *)&local_150);
  gc_heap_ptr<mjs::interpreter::impl::scope>::~gc_heap_ptr
            ((gc_heap_ptr<mjs::interpreter::impl::scope> *)&local_150);
  gc_heap_ptr<mjs::interpreter::impl::scope>::~gc_heap_ptr(&local_170);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_160);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_98);
  return;
}

Assistant:

explicit impl(gc_heap& h, version ver, const on_statement_executed_type& on_statement_executed)
        : heap_(h)
        , global_(global_object::make(h, ver, strict_mode_))
        , on_statement_executed_(on_statement_executed) {

        global_->set_stack_trace_function([this]() {
            return stack_trace();
        });

        assert(!global_->has_property(L"eval"));
        put_native_function(global_, global_, "eval", [this](const value&, const std::vector<value>& args) {
            // ES3, 15.1.2.1
            if (args.empty()) {
                return value::undefined;
            } else if (args.front().type() != value_type::string) {
                return args.front();
            }
            std::unique_ptr<block_statement> bs;

            try {
                bs = parse(std::make_shared<source_file>(L"eval", args.front().string_value().view(), global_->language_version()), strict_mode_ ? parse_mode::strict : parse_mode::non_strict);
            } catch (const std::exception&) {
                throw native_error_exception{native_error_type::syntax, stack_trace(), L"Invalid argument to eval"};
            }

            std::unique_ptr<auto_scope> eval_scope;
            if (bs->strict_mode()) {
                eval_scope.reset(new auto_scope{*this, activation_object::make(global_, {}, {}), active_scope_});
            }

            const std::unique_ptr<force_global_scope> fgs{!was_direct_call_to_eval_ ? new force_global_scope{*this} : nullptr};
            hoist(*bs);
            auto c = eval(*bs);
            if (!c) {
                return c.result;
            } else if (c.type == completion_type::throw_) {
                assert(c.result.type() == value_type::object); // FIXME should probably support any value type?
                rethrow_error(c.result.object_value());
            }

            std::wostringstream woss;
            woss << "Illegal " << c.type << " statement";
            throw native_error_exception{native_error_type::syntax, stack_trace(), woss.str()};
        }, 1);

        auto func_obj = global_->get(L"Function").object_value();
        assert(func_obj.has_type<function_object>());
        static_cast<function_object&>(*func_obj).put_function([this](const value&, const std::vector<value>& args) {
            std::wstring body{}, p{};
            if (args.empty()) {
            } else if (args.size() == 1) {
                body = to_string(heap_, args.front()).view();
            } else {
                p = to_string(heap_, args.front()).view();
                for (size_t k = 1; k < args.size() - 1; ++k) {
                    p += ',';
                    p += to_string(heap_, args[k]).view();
                }
                body = to_string(heap_, args.back()).view();
            }

            std::unique_ptr<block_statement> bs;
            try {
                bs = parse(std::make_shared<source_file>(L"Function definition", L"function anonymous(" + p + L") {\n" + body + L"\n}", global_->language_version()), strict_mode_ ? parse_mode::function_constructor_in_strict_context : parse_mode::non_strict);
            } catch (const std::exception&) {
                throw native_error_exception{native_error_type::syntax, stack_trace(), L"Invalid argument to function constructor"};
            }
            if (bs->l().size() != 1 || bs->l().front()->type() != statement_type::function_definition) {
                NOT_IMPLEMENTED("Invalid function definition: " << bs->extend().source_view());
            }

            return value{create_function(static_cast<const function_definition&>(*bs->l().front()), make_scope(global_, nullptr))};
        }, func_obj->class_name().unsafe_raw_get(), nullptr, 1);
        static_cast<function_object&>(*func_obj).default_construct_function();

        global_->function_prototype()->put(global_->common_string("constructor"), value{func_obj}, global_object::default_attributes);

        active_scope_ = make_scope(global_, nullptr);
    }